

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice.cpp
# Opt level: O1

void QInputDevicePrivate::unregisterDevice(QInputDevice *dev)

{
  QBasicMutex QVar1;
  QDebug this;
  Type *c;
  QLoggingCategory *pQVar2;
  QBasicMutex *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QDebug local_58;
  Stream *local_50;
  undefined1 local_48 [8];
  QInputDevice *local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>::guard._q_value.
                 super___atomic_base<signed_char>._M_i) {
    if ((AtomicType)devicesMutex.d_ptr._q_value._M_b._M_p == (AtomicType)0x0) {
      LOCK();
      devicesMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x1;
      UNLOCK();
    }
    else {
      in_RDI = &devicesMutex;
      QBasicMutex::lockInternal();
    }
    c = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::operator()
                  ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>
                    *)in_RDI);
    QtPrivate::sequential_erase_one<QList<QInputDevice_const*>,QInputDevice_const*>(c,&local_40);
    pQVar2 = QtPrivateLogging::lcQpaInputDevices();
    if (((pQVar2->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
      QMessageLogger::info();
      this.stream = local_58.stream;
      QVar3.m_data = (storage_type *)0xc;
      QVar3.m_size = (qsizetype)&local_38;
      QString::fromUtf8(QVar3);
      QTextStream::operator<<(&(this.stream)->ts,&local_38);
      if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_58.stream)->space == true) {
        QTextStream::operator<<(&(local_58.stream)->ts,' ');
      }
      local_50 = local_58.stream;
      (local_58.stream)->ref = (local_58.stream)->ref + 1;
      ::operator<<((Stream *)local_48,(QInputDevice *)&local_50);
      QDebug::~QDebug((QDebug *)local_48);
      QDebug::~QDebug((QDebug *)&local_50);
      QDebug::~QDebug(&local_58);
    }
    QVar1.d_ptr._q_value._M_b._M_p = devicesMutex.d_ptr._q_value._M_b._M_p;
    LOCK();
    devicesMutex.d_ptr._q_value._M_b._M_p = (QBasicAtomicPointer<QMutexPrivate>)(AtomicType)0x0;
    UNLOCK();
    if ((AtomicType)QVar1.d_ptr._q_value._M_b._M_p != (AtomicType)0x1) {
      QBasicMutex::unlockInternalFutex(&devicesMutex);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDevicePrivate::unregisterDevice(const QInputDevice *dev)
{
    if (deviceList.isDestroyed())
        return;     // nothing to remove!

    QMutexLocker lock(&devicesMutex);
    deviceList()->removeOne(dev);
    qCInfo(lcQpaInputDevices) << "Unregistered" << dev;
}